

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O2

options_description * __thiscall
program_options::options_description::add(options_description *this,options_description *desc)

{
  pointer psVar1;
  options_description *this_00;
  long lVar2;
  ulong uVar3;
  reference rVar4;
  shared_ptr<program_options::options_description> d;
  __shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<program_options::options_description,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (options_description *)operator_new(0x80);
  options_description(this_00,desc);
  std::__shared_ptr<program_options::options_description,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<program_options::options_description,void>(local_40,this_00);
  std::
  vector<std::shared_ptr<program_options::options_description>,_std::allocator<std::shared_ptr<program_options::options_description>_>_>
  ::push_back(&this->groups,(value_type *)local_40);
  lVar2 = 0;
  for (uVar3 = 0;
      psVar1 = (desc->m_options).
               super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(desc->m_options).
                            super__Vector_base<std::shared_ptr<program_options::option_description>,_std::allocator<std::shared_ptr<program_options::option_description>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar3 = uVar3 + 1) {
    std::__shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(psVar1->
                       super___shared_ptr<program_options::option_description,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + lVar2));
    add(this,(shared_ptr<program_options::option_description> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::back(&this->belong_to_group);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    lVar2 = lVar2 + 0x10;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return this;
}

Assistant:

options_description& options_description::add(const options_description& desc)
{
    std::shared_ptr<options_description> d(new options_description(desc));
    groups.push_back(d);

    for (size_t i = 0; i < desc.m_options.size(); ++i) {
        add(desc.m_options[i]);
        belong_to_group.back() = true;
    }

    return *this;
}